

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ClosePopup(ImGuiID id)

{
  bool bVar1;
  ImGuiContext *g;
  ImGuiID id_local;
  
  bVar1 = IsPopupOpen(id);
  if (bVar1) {
    ClosePopupToLevel((GImGui->OpenPopupStack).Size + -1);
  }
  return;
}

Assistant:

void ImGui::ClosePopup(ImGuiID id)
{
    if (!IsPopupOpen(id))
        return;
    ImGuiContext& g = *GImGui;
    ClosePopupToLevel(g.OpenPopupStack.Size - 1);
}